

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

int Nwk_ManPiNum(Nwk_Man_t *pNtk)

{
  int iVar1;
  Nwk_Obj_t *p;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < pNtk->vCis->nSize; i = i + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vCis,i);
    iVar1 = Nwk_ObjIsPi(p);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Nwk_ManPiNum( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, Counter = 0;
    Nwk_ManForEachCi( pNtk, pNode, i )
        Counter += Nwk_ObjIsPi( pNode );
    return Counter;
}